

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O2

void __thiscall t_d_generator::generate_enum(t_d_generator *this,t_enum *tenum)

{
  ofstream_with_content_based_conditional_update *out;
  int *piVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  pointer pptVar4;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string enum_name;
  _Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_> local_88;
  string local_70;
  string local_50;
  
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&local_88,&tenum->constants_
            );
  out = &this->f_types_;
  emit_doc(this,(t_doc *)tenum,(ostream *)out);
  iVar2 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  suffix_if_reserved(&local_50,(string *)CONCAT44(extraout_var,iVar2));
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)out,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,"enum ");
  poVar3 = std::operator<<(poVar3,(string *)&local_50);
  poVar3 = std::operator<<(poVar3," {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  for (pptVar4 = local_88._M_impl.super__Vector_impl_data._M_start;
      pptVar4 != local_88._M_impl.super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    emit_doc(this,&(*pptVar4)->super_t_doc,(ostream *)out);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)out);
    suffix_if_reserved(&local_70,&(*pptVar4)->name_);
    std::operator<<(poVar3,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    poVar3 = std::operator<<((ostream *)out," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(*pptVar4)->value_);
    std::operator<<(poVar3,",");
  }
  std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)out);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  std::_Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

void generate_enum(t_enum* tenum) override {
    vector<t_enum_value*> constants = tenum->get_constants();

    this->emit_doc(tenum, f_types_);
    string enum_name = suffix_if_reserved(tenum->get_name());
    f_types_ << indent() << "enum " << enum_name << " {" << endl;

    indent_up();

    vector<t_enum_value*>::const_iterator c_iter;
    for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
      this->emit_doc(*c_iter, f_types_);
      indent(f_types_) << suffix_if_reserved((*c_iter)->get_name());
      f_types_ << " = " << (*c_iter)->get_value() << ",";
    }

    f_types_ << endl;
    indent_down();
    indent(f_types_) << "}" << endl;

    f_types_ << endl;
  }